

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O0

SimpleString StringFromOrdinalNumber(uint number)

{
  uint uVar1;
  uint in_ESI;
  char *in_RDI;
  SimpleString SVar2;
  char *suffix;
  uint onesDigit;
  char *local_18;
  
  uVar1 = in_ESI % 10;
  if ((in_ESI < 0xb) || (0xd < in_ESI)) {
    if (uVar1 == 3) {
      local_18 = "rd";
    }
    else if (uVar1 == 2) {
      local_18 = "nd";
    }
    else if (uVar1 == 1) {
      local_18 = "st";
    }
    else {
      local_18 = "th";
    }
  }
  else {
    local_18 = "th";
  }
  SVar2 = StringFromFormat(in_RDI,"%u%s",(ulong)in_ESI,local_18);
  SVar2.buffer_ = in_RDI;
  return SVar2;
}

Assistant:

SimpleString StringFromOrdinalNumber(unsigned int number)
{
    unsigned int onesDigit = number % 10;

    const char* suffix;
    if (number >= 11 && number <= 13) {
        suffix = "th";
    } else if (3 == onesDigit) {
        suffix = "rd";
    } else if (2 == onesDigit) {
        suffix = "nd";
    } else if (1 == onesDigit) {
        suffix = "st";
    } else {
        suffix = "th";
    }

    return StringFromFormat("%u%s", number, suffix);
}